

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::DeadBranchElimPass::Process(DeadBranchElimPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  bool bVar2;
  Instruction *ai;
  Instruction *pIVar3;
  Status SVar4;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  pMVar1 = (this_00->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar3 = *(Instruction **)
            ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while( true ) {
    if (pIVar3 == (Instruction *)
                  ((long)&(pMVar1->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
      local_30._8_8_ = 0;
      local_18 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:479:25)>
                 ::_M_invoke;
      local_20 = std::
                 _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:479:25)>
                 ::_M_manager;
      local_30._M_unused._M_object = this;
      bVar2 = IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)&local_30);
      SVar4 = SuccessWithoutChange;
      if (bVar2) {
        FixBlockOrder(this);
        SVar4 = SuccessWithChange;
      }
      if (local_20 != (code *)0x0) {
        (*local_20)(&local_30,&local_30,__destroy_functor);
      }
      return SVar4;
    }
    if (pIVar3->opcode_ == OpGroupDecorate) break;
    pIVar3 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return SuccessWithoutChange;
}

Assistant:

Pass::Status DeadBranchElimPass::Process() {
  // Do not process if module contains OpGroupDecorate. Additional
  // support required in KillNamesAndDecorates().
  // TODO(greg-lunarg): Add support for OpGroupDecorate
  for (auto& ai : get_module()->annotations())
    if (ai.opcode() == spv::Op::OpGroupDecorate)
      return Status::SuccessWithoutChange;
  // Process all entry point functions
  ProcessFunction pfn = [this](Function* fp) {
    return EliminateDeadBranches(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  if (modified) FixBlockOrder();
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}